

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::processConfigUpdateMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  Time propertyVal;
  bool value;
  action_t aVar1;
  ActionMessage *in_RSI;
  TimeCoordinator *in_RDI;
  int in_stack_ffffffffffffffd4;
  int32_t optionFlag;
  undefined4 in_stack_ffffffffffffffe0;
  
  aVar1 = ActionMessage::action(in_RSI);
  if (aVar1 == cmd_fed_configure_time) {
    propertyVal.internalTimeCode._4_4_ = 0xca;
    propertyVal.internalTimeCode._0_4_ = in_stack_ffffffffffffffe0;
    setProperty(in_RDI,in_stack_ffffffffffffffd4,propertyVal);
  }
  else if (aVar1 == cmd_fed_configure_int) {
    setProperty((TimeCoordinator *)CONCAT44(0xcb,in_stack_ffffffffffffffe0),
                (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else if (aVar1 == cmd_fed_configure_flag) {
    optionFlag = in_RSI->messageID;
    value = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
    setOptionFlag(in_RDI,optionFlag,value);
  }
  return;
}

Assistant:

void TimeCoordinator::processConfigUpdateMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_FED_CONFIGURE_TIME:
            setProperty(cmd.messageID, cmd.actionTime);
            break;
        case CMD_FED_CONFIGURE_INT:
            setProperty(cmd.messageID, cmd.counter);
            break;
        case CMD_FED_CONFIGURE_FLAG:
            setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
            break;
        default:
            break;
    }
}